

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcePack.cpp
# Opt level: O1

void __thiscall ResourcePack::load_shader(ResourcePack *this,string *name)

{
  string *__k;
  char cVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  int InfoLogLength;
  GLint Result;
  char *FragmentSourcePointer;
  string FragmentShaderCode;
  string VertexShaderCode;
  string vertex_file_path;
  string fragment_file_path;
  char *VertexSourcePointer;
  stringstream sstr_1;
  ifstream FragmentShaderStream;
  ostringstream fragment_file_path_stream;
  ostringstream vertex_file_path_stream;
  ifstream VertexShaderStream;
  uint local_974;
  allocator_type local_96d;
  GLint local_96c;
  string *local_968;
  GLchar *local_960;
  GLchar *local_958;
  undefined8 local_950;
  GLchar local_948 [16];
  GLchar *local_938;
  undefined8 local_930;
  GLchar local_928 [16];
  char *local_918;
  char local_908 [16];
  char *local_8f8;
  char local_8e8 [16];
  GLchar *local_8d8 [2];
  GLchar local_8c8 [16];
  undefined1 local_8b8 [128];
  ios_base local_838 [264];
  stringstream local_730 [16];
  ostream local_720 [112];
  ios_base local_6b0 [392];
  ostringstream local_528 [112];
  ios_base local_4b8 [264];
  ostringstream local_3b0 [112];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  streambuf local_228 [504];
  
  std::__cxx11::ostringstream::ostringstream(local_3b0);
  std::__cxx11::ostringstream::ostringstream(local_528);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"../res/",7);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3b0,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".vert",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_528,"../res/",7);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_528,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".frag",5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  GVar2 = (*__glewCreateShader)(0x8b31);
  GVar3 = (*__glewCreateShader)(0x8b30);
  local_938 = local_928;
  local_930 = 0;
  local_928[0] = '\0';
  std::ifstream::ifstream(local_238,local_918,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__cxx11::stringstream::stringstream(local_730);
    std::ostream::operator<<(local_720,local_228);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_938,(string *)local_8b8);
    if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
      operator_delete((void *)local_8b8._0_8_);
    }
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream(local_730);
    std::ios_base::~ios_base(local_6b0);
    local_958 = local_948;
    local_950 = 0;
    local_948[0] = '\0';
    std::ifstream::ifstream(local_730,local_8f8,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_8b8);
      std::ostream::operator<<((ostream *)(local_8b8 + 0x10),(streambuf *)local_720);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_958,(string *)local_8d8);
      if (local_8d8[0] != local_8c8) {
        operator_delete(local_8d8[0]);
      }
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_8b8);
      std::ios_base::~ios_base(local_838);
    }
    local_96c = 0;
    local_968 = name;
    printf("Compiling shader : %s\n",local_918);
    local_8d8[0] = local_938;
    (*__glewShaderSource)(GVar2,1,local_8d8,(GLint *)0x0);
    (*__glewCompileShader)(GVar2);
    (*__glewGetShaderiv)(GVar2,0x8b81,&local_96c);
    (*__glewGetShaderiv)(GVar2,0x8b84,(GLint *)&local_974);
    if (0 < (int)local_974) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_8b8,(ulong)local_974 + 1,
                 (allocator_type *)&local_960);
      (*__glewGetShaderInfoLog)(GVar2,local_974,(GLsizei *)0x0,(GLchar *)local_8b8._0_8_);
      puts((char *)local_8b8._0_8_);
      if ((GLchar *)local_8b8._0_8_ != (GLchar *)0x0) {
        operator_delete((void *)local_8b8._0_8_);
      }
    }
    printf("Compiling shader : %s\n",local_8f8);
    local_960 = local_958;
    (*__glewShaderSource)(GVar3,1,&local_960,(GLint *)0x0);
    (*__glewCompileShader)(GVar3);
    (*__glewGetShaderiv)(GVar3,0x8b81,&local_96c);
    (*__glewGetShaderiv)(GVar3,0x8b84,(GLint *)&local_974);
    __k = local_968;
    if (0 < (int)local_974) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_8b8,(ulong)local_974 + 1,&local_96d);
      (*__glewGetShaderInfoLog)(GVar3,local_974,(GLsizei *)0x0,(GLchar *)local_8b8._0_8_);
      puts((char *)local_8b8._0_8_);
      if ((GLchar *)local_8b8._0_8_ != (GLchar *)0x0) {
        operator_delete((void *)local_8b8._0_8_);
      }
    }
    puts("Linking program");
    GVar4 = (*__glewCreateProgram)();
    (*__glewAttachShader)(GVar4,GVar2);
    (*__glewAttachShader)(GVar4,GVar3);
    (*__glewLinkProgram)(GVar4);
    (*__glewGetProgramiv)(GVar4,0x8b82,&local_96c);
    (*__glewGetProgramiv)(GVar4,0x8b84,(GLint *)&local_974);
    if (0 < (int)local_974) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_8b8,(ulong)local_974 + 1,&local_96d);
      (*__glewGetProgramInfoLog)(GVar4,local_974,(GLsizei *)0x0,(GLchar *)local_8b8._0_8_);
      puts((char *)local_8b8._0_8_);
      if ((char *)local_8b8._0_8_ != (char *)0x0) {
        operator_delete((void *)local_8b8._0_8_);
      }
    }
    (*__glewDetachShader)(GVar4,GVar2);
    (*__glewDetachShader)(GVar4,GVar3);
    (*__glewDeleteShader)(GVar2);
    (*__glewDeleteShader)(GVar3);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&this->programs,__k);
    *pmVar6 = GVar4;
    std::ifstream::~ifstream(local_730);
    if (local_958 != local_948) {
      operator_delete(local_958);
    }
    std::ifstream::~ifstream(local_238);
    if (local_938 != local_928) {
      operator_delete(local_938);
    }
    if (local_8f8 != local_8e8) {
      operator_delete(local_8f8);
    }
    if (local_918 != local_908) {
      operator_delete(local_918);
    }
    std::__cxx11::ostringstream::~ostringstream(local_528);
    std::ios_base::~ios_base(local_4b8);
    std::__cxx11::ostringstream::~ostringstream(local_3b0);
    std::ios_base::~ios_base(local_340);
    return;
  }
  printf("Could not open shader %s\n",local_918);
  getchar();
  exit(1);
}

Assistant:

void ResourcePack::load_shader(std::string& name) {
    std::ostringstream vertex_file_path_stream, fragment_file_path_stream;
    vertex_file_path_stream << "../res/" << name << ".vert";
    fragment_file_path_stream << "../res/" << name << ".frag";
   
    std::string vertex_file_path = vertex_file_path_stream.str();
    std::string fragment_file_path = fragment_file_path_stream.str();

    // Create the shaders
    GLuint VertexShaderID = glCreateShader(GL_VERTEX_SHADER);
    GLuint FragmentShaderID = glCreateShader(GL_FRAGMENT_SHADER);

    // Read the Vertex Shader code from the file
    std::string VertexShaderCode;
    std::ifstream VertexShaderStream(vertex_file_path.c_str(), std::ios::in);
    if(VertexShaderStream.is_open()) {
        std::stringstream sstr;
        sstr << VertexShaderStream.rdbuf();
        VertexShaderCode = sstr.str();
        VertexShaderStream.close();
    }
    else {
        printf("Could not open shader %s\n", vertex_file_path.c_str());
        getchar();
        exit(1);
    }

    // Read the Fragment Shader code from the file
    std::string FragmentShaderCode;
    std::ifstream FragmentShaderStream(fragment_file_path.c_str(), std::ios::in);
    if(FragmentShaderStream.is_open()){
        std::stringstream sstr;
        sstr << FragmentShaderStream.rdbuf();
        FragmentShaderCode = sstr.str();
        FragmentShaderStream.close();
    }

    GLint Result = GL_FALSE;
    int InfoLogLength;

    // Compile Vertex Shader
    printf("Compiling shader : %s\n", vertex_file_path.c_str());
    char const * VertexSourcePointer = VertexShaderCode.c_str();
    glShaderSource(VertexShaderID, 1, &VertexSourcePointer , NULL);
    glCompileShader(VertexShaderID);

    // Check Vertex Shader
    glGetShaderiv(VertexShaderID, GL_COMPILE_STATUS, &Result);
    glGetShaderiv(VertexShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
    if ( InfoLogLength > 0 ){
        std::vector<char> VertexShaderErrorMessage(InfoLogLength+1);
        glGetShaderInfoLog(VertexShaderID, InfoLogLength, NULL, &VertexShaderErrorMessage[0]);
        printf("%s\n", &VertexShaderErrorMessage[0]);
    }

    // Compile Fragment Shader
    printf("Compiling shader : %s\n", fragment_file_path.c_str());
    char const * FragmentSourcePointer = FragmentShaderCode.c_str();
    glShaderSource(FragmentShaderID, 1, &FragmentSourcePointer , NULL);
    glCompileShader(FragmentShaderID);

    // Check Fragment Shader
    glGetShaderiv(FragmentShaderID, GL_COMPILE_STATUS, &Result);
    glGetShaderiv(FragmentShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
    if ( InfoLogLength > 0 ){
        std::vector<char> FragmentShaderErrorMessage(InfoLogLength+1);
        glGetShaderInfoLog(FragmentShaderID, InfoLogLength, NULL, &FragmentShaderErrorMessage[0]);
        printf("%s\n", &FragmentShaderErrorMessage[0]);
    }

    // Link the program
    printf("Linking program\n");
    GLuint ProgramID = glCreateProgram();
    glAttachShader(ProgramID, VertexShaderID);
    glAttachShader(ProgramID, FragmentShaderID);
    glLinkProgram(ProgramID);

    // Check the program
    glGetProgramiv(ProgramID, GL_LINK_STATUS, &Result);
    glGetProgramiv(ProgramID, GL_INFO_LOG_LENGTH, &InfoLogLength);
    if (InfoLogLength > 0){
        std::vector<char> ProgramErrorMessage(InfoLogLength+1);
        glGetProgramInfoLog(ProgramID, InfoLogLength, NULL, &ProgramErrorMessage[0]);
        printf("%s\n", &ProgramErrorMessage[0]);
    }

    glDetachShader(ProgramID, VertexShaderID);
    glDetachShader(ProgramID, FragmentShaderID);

    glDeleteShader(VertexShaderID);
    glDeleteShader(FragmentShaderID);

    programs[name] = ProgramID;
}